

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O3

int __thiscall
skiwi::environment<skiwi::environment_entry>::remove
          (environment<skiwi::environment_entry> *this,char *__filename)

{
  element_type *peVar1;
  int iVar2;
  int extraout_EAX;
  iterator iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> p_outer_copy;
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
                  *)this,(key_type *)__filename);
  if ((_Rb_tree_header *)iVar3._M_node != &(this->env)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::environment_entry>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::environment_entry>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
                        *)this,iVar3);
  }
  local_20 = (this->p_outer).
             super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Var4 = (this->p_outer).
           super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_18._M_pi = p_Var4;
  if (local_20 != (element_type *)0x0) {
    do {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
                      *)local_20,(key_type *)__filename);
      if ((_Rb_tree_header *)iVar3._M_node != &(local_20->env)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::environment_entry>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,skiwi::environment_entry>,std::_Select1st<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,skiwi::environment_entry>>>
                            *)local_20,iVar3);
      }
      peVar1 = (local_20->p_outer).
               super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                         (&local_18,
                          &(local_20->p_outer).
                           super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
      local_20 = peVar1;
    } while (peVar1 != (element_type *)0x0);
  }
  iVar2 = (int)p_Var4;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void remove(const std::string& name)
      {
      auto it = env.find(name);
      if (it != env.end())
        {
        env.erase(it);
        }
      //if (p_outer)
      //  p_outer->remove(name);
      auto p_outer_copy = p_outer;
      while (p_outer_copy)
        {
        it = p_outer_copy->env.find(name);
        if (it != p_outer_copy->env.end())
          {
          p_outer_copy->env.erase(it);
          }
        p_outer_copy = p_outer_copy->p_outer;
        }
      }